

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

monitor * monitor_list_get_workspace_monitor(monitor_list *monitor_list,workspace *workspace)

{
  monitor *pmVar1;
  list *plVar2;
  
  if (workspace == (workspace *)0x0) {
LAB_00107eec:
    pmVar1 = (monitor *)0x0;
  }
  else {
    plVar2 = monitor_list->monitors;
    do {
      plVar2 = (list *)plVar2->head;
      if (plVar2 == (list *)0x0) goto LAB_00107eec;
      pmVar1 = (monitor *)plVar2->size;
    } while ((pmVar1->workspace == (workspace *)0x0) ||
            (pmVar1->workspace->index != workspace->index));
  }
  return pmVar1;
}

Assistant:

struct monitor *monitor_list_get_workspace_monitor(const struct monitor_list *monitor_list,
                                                   const struct workspace *workspace)
{
        if (workspace == NULL) {
                return NULL;
        }

        LIST_FOR_EACH(monitor_list->monitors, monitor_item)
        {
                struct monitor *monitor = (struct monitor *)monitor_item->data;

                if (monitor->workspace == NULL) {
                        continue;
                }

                if (monitor->workspace->index == workspace->index) {
                        return monitor;
                }
        }

        return NULL;
}